

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniply.cpp
# Opt level: O3

bool __thiscall miniply::PLYReader::load_ascii_list_property(PLYReader *this,PLYProperty *prop)

{
  iterator __position;
  bool bVar1;
  uint uVar2;
  long lVar3;
  int count;
  uint local_40;
  uint local_3c;
  ulong local_38;
  
  local_40 = 0;
  if ((((int)prop->countType < 6) && (bVar1 = int_literal(this,(int *)&local_40), bVar1)) &&
     (bVar1 = advance(this), bVar1)) {
    this->m_valid = -1 < (int)local_40;
    if (-1 >= (int)local_40) {
      return false;
    }
    local_38 = (ulong)*(uint *)(kPLYPropertySize + (ulong)prop->type * 4);
    lVar3 = (long)(prop->listData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(prop->listData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    local_3c = local_40;
    __position._M_current =
         (prop->rowCount).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (prop->rowCount).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (&prop->rowCount,__position,&local_3c);
    }
    else {
      *__position._M_current = local_40;
      (prop->rowCount).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&prop->listData,(long)(int)local_40 * local_38 + lVar3);
    if (local_40 == 0) {
      return true;
    }
    uVar2 = 0;
    while (bVar1 = ascii_value(this,prop->type,
                               (prop->listData).
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start + lVar3), bVar1) {
      lVar3 = lVar3 + local_38;
      uVar2 = uVar2 + 1;
      if (local_40 <= uVar2) {
        return true;
      }
    }
  }
  this->m_valid = false;
  return false;
}

Assistant:

bool PLYReader::load_ascii_list_property(PLYProperty& prop)
  {
    int count = 0;
    m_valid = (prop.countType < PLYPropertyType::Float) && int_literal(&count) && advance() && (count >= 0);
    if (!m_valid) {
      return false;
    }

    const size_t numBytes = kPLYPropertySize[uint32_t(prop.type)];

    size_t back = prop.listData.size();
    prop.rowCount.push_back(static_cast<uint32_t>(count));
    prop.listData.resize(back + numBytes * size_t(count));

    for (uint32_t i = 0; i < uint32_t(count); i++) {
      if (!ascii_value(prop.type, prop.listData.data() + back)) {
        m_valid = false;
        return false;
      }
      back += numBytes;
    }

    return true;
  }